

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_uniform(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint uVar2;
  SPIRType *pSVar3;
  CompilerError *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if (((*(int *)&(pSVar3->super_IVariant).field_0xc == 0x10) && ((pSVar3->image).sampled == 2)) &&
     ((pSVar3->image).dim != DimSubpassData)) {
    bVar1 = (this->options).es;
    uVar2 = (this->options).version;
    if (uVar2 < 0x1a4 && bVar1 == false) {
      ::std::__cxx11::string::string
                ((string *)&sStack_58,"GL_ARB_shader_image_load_store",(allocator *)&local_38);
      require_extension_internal(this,&sStack_58);
      ::std::__cxx11::string::~string((string *)&sStack_58);
    }
    else if ((bVar1 & uVar2 < 0x136) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sStack_58,"At least ESSL 3.10 required for shader image load store.",
                 (allocator *)&local_38);
      CompilerError::CompilerError(this_00,&sStack_58);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  add_resource_name(this,(var->super_IVariant).self.id);
  layout_for_variable_abi_cxx11_(&sStack_58,this,var);
  (*(this->super_Compiler)._vptr_Compiler[0x24])(&local_38,this,var);
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,&sStack_58,&local_38,(char (*) [2])0x304bae);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void CompilerGLSL::emit_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		if (!options.es && options.version < 420)
			require_extension_internal("GL_ARB_shader_image_load_store");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for shader image load store.");
	}

	add_resource_name(var.self);
	statement(layout_for_variable(var), variable_decl(var), ";");
}